

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void pangram_suite::test_danish(void)

{
  undefined4 local_1f0;
  value local_1ec [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined4 local_1b4;
  value local_1b0 [2];
  undefined1 local_1a8 [8];
  decoder_type decoder;
  char input [105];
  
  decoder.current.scan.string.segment_tail[0x1f] = (const_pointer)0x6c65647a69755122;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<105ul>
            ((basic_decoder<char> *)local_1a8,
             (value_type (*) [105])((long)&decoder.current.scan + 0x100));
  local_1b0[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_1a8);
  local_1b4 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x907,"void pangram_suite::test_danish()",local_1b0,&local_1b4);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_1d8,(basic_decoder<char> *)local_1a8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[91]>
            ("decoder.string_value<std::string>()",anon_var_dwarf_710e,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x908,"void pangram_suite::test_danish()",&local_1d8,anon_var_dwarf_711a);
  std::__cxx11::string::~string((string *)&local_1d8);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_1a8);
  local_1ec[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_1a8);
  local_1f0 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x90a,"void pangram_suite::test_danish()",local_1ec,&local_1f0);
  return;
}

Assistant:

void test_danish()
{
    const char input[] = "\"Quizdeltagerne spiste jordb\\u00E6r med fl\\u00F8de, mens cirkusklovnen Wolther spillede p\\u00E5 xylofon\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "Quizdeltagerne spiste jordbær med fløde, mens cirkusklovnen Wolther spillede på xylofon");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}